

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O2

void key_iterator_suite::iterate_null(void)

{
  bool v;
  variable data;
  key_iterator where;
  type local_d8;
  undefined1 local_b8;
  key_iterator local_a8;
  key_iterator local_58;
  
  local_b8 = 0;
  local_d8._0_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_58,(basic_variable<std::allocator<char>_> *)&local_d8.__align);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_a8,(basic_variable<std::allocator<char>_> *)&local_d8.__align);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::equals(&local_58.
                super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
               ,&local_a8);
  boost::detail::test_impl
            ("where == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xbe7,"void key_iterator_suite::iterate_null()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_58);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
                  *)&local_d8.__align);
  return;
}

Assistant:

void iterate_null()
{
    variable data;
    auto where = data.key_begin();
    TRIAL_PROTOCOL_TEST(where == data.key_end());
}